

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

bool __thiscall Engine::propagate(Engine *this)

{
  int iVar1;
  IntVar **ppIVar2;
  vec<Propagator_*> *pvVar3;
  long *plVar4;
  long lVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  long lVar9;
  uint i;
  ulong uVar10;
  
  if (this->async_fail == true) {
    this->async_fail = false;
  }
  else {
    this->last_prop = (Propagator *)0x0;
    do {
      bVar6 = SAT::consistent(&sat);
      if ((!bVar6) && (bVar6 = SAT::propagate(&sat), !bVar6)) {
        return false;
      }
      for (uVar10 = 0; ppIVar2 = (this->v_queue).data, uVar10 < (this->v_queue).sz;
          uVar10 = uVar10 + 1) {
        IntVar::wakePropagators(ppIVar2[uVar10]);
      }
      if (ppIVar2 != (IntVar **)0x0) {
        (this->v_queue).sz = 0;
      }
      if (sat.confl != (Clause *)0x0) {
        return false;
      }
      this->last_prop = (Propagator *)0x0;
      pvVar3 = (this->p_queue).data;
      lVar5 = 0;
      do {
        lVar9 = lVar5;
        if (lVar9 + 0x10 == 0x70) {
          return true;
        }
        iVar1 = *(int *)((long)&pvVar3->sz + lVar9);
        lVar5 = lVar9 + 0x10;
      } while (iVar1 == 0);
      uVar8 = iVar1 - 1;
      plVar4 = *(long **)(*(long *)((long)&pvVar3->data + lVar9) + (ulong)uVar8 * 8);
      *(uint *)((long)&pvVar3->sz + lVar9) = uVar8;
      this->propagations = this->propagations + 1;
      cVar7 = (**(code **)(*plVar4 + 0x18))(plVar4);
      (**(code **)(*plVar4 + 0x20))(plVar4);
    } while (cVar7 != '\0');
  }
  return false;
}

Assistant:

bool Engine::propagate() {
	if (async_fail) {
		async_fail = false;
		assert(!so.lazy || sat.confl);
		return false;
	}

	last_prop = nullptr;

WakeUp:

	if (!sat.consistent() && !sat.propagate()) {
		return false;
	}

	for (unsigned int i = 0; i < v_queue.size(); i++) {
		v_queue[i]->wakePropagators();
	}
	v_queue.clear();

	if (sat.confl != nullptr) {
		return false;
	}

	last_prop = nullptr;

	for (int i = 0; i < num_queues; i++) {
		if (p_queue[i].size() != 0) {
			Propagator* p = p_queue[i].last();
			p_queue[i].pop();
			propagations++;
			const bool ok = p->propagate();
			p->clearPropState();
			if (!ok) {
				return false;
			}
			goto WakeUp;
		}
	}

	return true;
}